

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O1

int __thiscall kj::Url::clone(Url *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  code hasTrailingSlash;
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  QueryParam *pQVar5;
  RemoveConst<kj::Url::QueryParam> *pRVar6;
  QueryParam *pQVar7;
  size_t sVar8;
  Url *pUVar9;
  char *pcVar10;
  RemoveConst<kj::String> *pRVar11;
  ArrayDisposer *pAVar12;
  String *params;
  String *params_00;
  String *extraout_RDX;
  String *extraout_RDX_00;
  String *extraout_RDX_01;
  String *pSVar13;
  String *extraout_RDX_02;
  String *extraout_RDX_03;
  String *extraout_RDX_04;
  String *params_01;
  String *extraout_RDX_05;
  String *pSVar14;
  kj *pkVar15;
  kj *pkVar16;
  ArrayBuilder<kj::String> builder;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 aStack_178;
  ArrayBuilder<kj::Url::QueryParam> builder_1;
  Array<kj::Url::QueryParam> result_1;
  Vector<kj::Url::QueryParam> local_118;
  Array<kj::String> result;
  Vector<kj::String> local_d8;
  Url *local_b0;
  String local_a8;
  String local_88;
  Maybe<kj::Url::UserInfo> local_70;
  
  str<kj::String_const&>(&local_88,(kj *)__fn,(String *)__child_stack);
  if (__fn[0x18] == (__fn)0x0) {
    local_70.ptr.isSet = false;
    pSVar13 = params;
  }
  else {
    str<kj::String_const&>((String *)&builder,(kj *)(__fn + 0x20),params);
    if (__fn[0x38] == (__fn)0x0) {
      builder.disposer = (ArrayDisposer *)((ulong)builder.disposer & 0xffffffffffffff00);
    }
    else {
      str<kj::String_const&>((String *)&builder_1,(kj *)(__fn + 0x40),params_00);
      builder.disposer = (ArrayDisposer *)CONCAT71(builder.disposer._1_7_,1);
      aStack_178.value.content.ptr = (char *)builder_1.ptr;
      aStack_178.value.content.size_ = (size_t)builder_1.pos;
      aStack_178.value.content.disposer = (ArrayDisposer *)builder_1.endPtr;
    }
    uVar4 = aStack_178.value.content.size_;
    uVar3 = aStack_178.value.content.ptr;
    Maybe<kj::Url::UserInfo>::Maybe(&local_70,(UserInfo *)&builder);
    pSVar13 = extraout_RDX;
    if (((char)builder.disposer == '\x01') &&
       ((QueryParam *)aStack_178.value.content.ptr != (QueryParam *)0x0)) {
      aStack_178.value.content.ptr = (char *)0x0;
      aStack_178.value.content.size_ = 0;
      (**(code **)(((String *)&(aStack_178.value.content.disposer)->_vptr_ArrayDisposer)->content).
                  ptr)(aStack_178.value.content.disposer,uVar3,1,uVar4,uVar4,0);
      pSVar13 = extraout_RDX_00;
    }
    pRVar11 = builder.pos;
    pSVar14 = builder.ptr;
    if (builder.ptr != (String *)0x0) {
      builder.ptr = (String *)0x0;
      builder.pos = (RemoveConst<kj::String> *)0x0;
      (**(code **)((builder.endPtr)->content).ptr)(builder.endPtr,pSVar14,1,pRVar11,pRVar11,0);
      pSVar13 = extraout_RDX_01;
    }
  }
  str<kj::String_const&>(&local_a8,(kj *)(__fn + 0x58),pSVar13);
  lVar1 = *(long *)(__fn + 0x78);
  lVar2 = *(long *)(__fn + 0x70);
  local_b0 = this;
  builder.ptr = (String *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (0x18,0,(lVar1 - lVar2 >> 3) * -0x5555555555555555,
                           (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  builder.endPtr = (String *)((lVar1 - lVar2) + (long)builder.ptr);
  builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pkVar15 = *(kj **)(__fn + 0x70);
  builder.pos = builder.ptr;
  if (pkVar15 != *(kj **)(__fn + 0x78)) {
    pSVar13 = extraout_RDX_02;
    do {
      str<kj::String_const&>((String *)&builder_1,pkVar15,pSVar13);
      ((builder.pos)->content).ptr = (char *)builder_1.ptr;
      ((builder.pos)->content).size_ = (size_t)builder_1.pos;
      ((builder.pos)->content).disposer = (ArrayDisposer *)builder_1.endPtr;
      builder.pos = builder.pos + 1;
      pkVar15 = pkVar15 + 0x18;
      pSVar13 = extraout_RDX_03;
    } while (pkVar15 != *(kj **)(__fn + 0x78));
  }
  local_d8.builder.ptr = builder.ptr;
  local_d8.builder.pos = builder.pos;
  local_d8.builder.endPtr = builder.pos;
  result.disposer = builder.disposer;
  local_d8.builder.disposer = builder.disposer;
  result.ptr = (String *)0x0;
  result.size_ = 0;
  lVar1 = *(long *)(__fn + 0xa0);
  lVar2 = *(long *)(__fn + 0x98);
  hasTrailingSlash = __fn[0x90];
  builder_1.ptr =
       (QueryParam *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x30,0,(lVar1 - lVar2 >> 4) * -0x5555555555555555,(_func_void_void_ptr *)0x0,
                  (_func_void_void_ptr *)0x0);
  builder_1.endPtr = (QueryParam *)((lVar1 - lVar2) + (long)builder_1.ptr);
  builder_1.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  builder_1.pos = builder_1.ptr;
  if (*(long *)(__fn + 0x98) != *(long *)(__fn + 0xa0)) {
    pSVar14 = extraout_RDX_04;
    pkVar15 = (kj *)(*(long *)(__fn + 0x98) + 0x18);
    pSVar13 = builder.ptr;
    pRVar11 = builder.pos;
    pAVar12 = builder.disposer;
    do {
      builder.disposer = pAVar12;
      builder.pos = pRVar11;
      builder.ptr = pSVar13;
      str<kj::String_const&>((String *)&builder,pkVar15 + -0x18,pSVar14);
      if ((*(long *)(pkVar15 + 8) == 0) || (*(long *)pkVar15 == 0)) {
        builder.disposer = (ArrayDisposer *)0x0;
        aStack_178.value.content.ptr = (char *)0x0;
        aStack_178.value.content.size_ = 0;
        pSVar14 = params_01;
      }
      else {
        str<kj::String_const&>((String *)&builder.disposer,pkVar15,params_01);
        pSVar14 = extraout_RDX_05;
      }
      ((builder_1.pos)->name).content.ptr = (char *)builder.ptr;
      ((builder_1.pos)->name).content.size_ = (size_t)builder.pos;
      ((builder_1.pos)->name).content.disposer = (ArrayDisposer *)builder.endPtr;
      builder.ptr = (String *)0x0;
      pSVar13 = builder.ptr;
      builder.pos = (RemoveConst<kj::String> *)0x0;
      pRVar11 = builder.pos;
      ((builder_1.pos)->value).content.ptr = (char *)builder.disposer;
      ((builder_1.pos)->value).content.size_ = (size_t)aStack_178.value.content.ptr;
      ((builder_1.pos)->value).content.disposer = (ArrayDisposer *)aStack_178.value.content.size_;
      builder.disposer = (ArrayDisposer *)0x0;
      pAVar12 = builder.disposer;
      aStack_178.value.content.ptr = (char *)0x0;
      builder_1.pos = builder_1.pos + 1;
      builder.disposer = (ArrayDisposer *)0x0;
      builder.pos = (RemoveConst<kj::String> *)0x0;
      builder.ptr = (String *)0x0;
      pkVar16 = pkVar15 + 0x18;
      pkVar15 = pkVar15 + 0x30;
    } while (pkVar16 != *(kj **)(__fn + 0xa0));
  }
  local_118.builder.ptr = builder_1.ptr;
  local_118.builder.pos = builder_1.pos;
  local_118.builder.endPtr = builder_1.pos;
  local_118.builder.disposer = builder_1.disposer;
  if (__fn[0xb8] == (__fn)0x0) {
    builder.ptr = (String *)((ulong)builder.ptr & 0xffffffffffffff00);
  }
  else {
    str<kj::String_const&>((String *)&builder_1,(kj *)(__fn + 0xc0),(String *)builder_1.disposer);
    builder.ptr = (String *)CONCAT71(builder.ptr._1_7_,1);
    builder.pos = &(builder_1.ptr)->name;
    builder.endPtr = &(builder_1.pos)->name;
    builder.disposer = (ArrayDisposer *)builder_1.endPtr;
  }
  pUVar9 = local_b0;
  Url(local_b0,&local_88,&local_70,&local_a8,&local_d8,(bool)hasTrailingSlash,&local_118,
      (Maybe<kj::String> *)&builder,SUB42(*(undefined4 *)(__fn + 0xd8),0));
  pSVar13 = builder.endPtr;
  pRVar11 = builder.pos;
  if (((char)builder.ptr == '\x01') && (builder.pos != (RemoveConst<kj::String> *)0x0)) {
    builder.pos = (RemoveConst<kj::String> *)0x0;
    builder.endPtr = (String *)0x0;
    (**(builder.disposer)->_vptr_ArrayDisposer)(builder.disposer,pRVar11,1,pSVar13,pSVar13,0);
  }
  pQVar7 = local_118.builder.endPtr;
  pRVar6 = local_118.builder.pos;
  pQVar5 = local_118.builder.ptr;
  if (local_118.builder.ptr != (QueryParam *)0x0) {
    local_118.builder.ptr = (QueryParam *)0x0;
    local_118.builder.pos = (RemoveConst<kj::Url::QueryParam> *)0x0;
    local_118.builder.endPtr = (RemoveConst<kj::Url::QueryParam> *)0x0;
    (**(local_118.builder.disposer)->_vptr_ArrayDisposer)
              (local_118.builder.disposer,pQVar5,0x30,
               ((long)pRVar6 - (long)pQVar5 >> 4) * -0x5555555555555555,
               ((long)pQVar7 - (long)pQVar5 >> 4) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Url::QueryParam>::destruct);
  }
  pSVar14 = local_d8.builder.endPtr;
  pRVar11 = local_d8.builder.pos;
  pSVar13 = local_d8.builder.ptr;
  if (local_d8.builder.ptr != (String *)0x0) {
    local_d8.builder.ptr = (String *)0x0;
    local_d8.builder.pos = (RemoveConst<kj::String> *)0x0;
    local_d8.builder.endPtr = (RemoveConst<kj::String> *)0x0;
    (**(local_d8.builder.disposer)->_vptr_ArrayDisposer)
              (local_d8.builder.disposer,pSVar13,0x18,
               ((long)pRVar11 - (long)pSVar13 >> 3) * -0x5555555555555555,
               ((long)pSVar14 - (long)pSVar13 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  sVar8 = result.size_;
  pSVar13 = result.ptr;
  if (result.ptr != (String *)0x0) {
    result.ptr = (String *)0x0;
    result.size_ = 0;
    (**(result.disposer)->_vptr_ArrayDisposer)
              (result.disposer,pSVar13,0x18,sVar8,sVar8,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  sVar8 = local_a8.content.size_;
  pcVar10 = local_a8.content.ptr;
  if (local_a8.content.ptr != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar10,1,sVar8,sVar8,0);
  }
  uVar4 = local_70.ptr.field_1._40_8_;
  uVar3 = local_70.ptr.field_1._32_8_;
  if (local_70.ptr.isSet == true) {
    if ((local_70.ptr.field_1.value.password.ptr.isSet == true) &&
       (local_70.ptr.field_1._32_8_ != 0)) {
      local_70.ptr.field_1._32_8_ = 0;
      local_70.ptr.field_1._40_8_ = 0;
      (*(code *)**(undefined8 **)local_70.ptr.field_1._48_8_)
                (local_70.ptr.field_1._48_8_,uVar3,1,uVar4,uVar4,0);
    }
    uVar4 = local_70.ptr.field_1.value.username.content.size_;
    uVar3 = local_70.ptr.field_1.value.username.content.ptr;
    if (local_70.ptr.field_1.value.username.content.ptr != (char *)0x0) {
      local_70.ptr.field_1.value.username.content.ptr = (char *)0x0;
      local_70.ptr.field_1.value.username.content.size_ = 0;
      (**(local_70.ptr.field_1.value.username.content.disposer)->_vptr_ArrayDisposer)
                (local_70.ptr.field_1.value.username.content.disposer,uVar3,1,uVar4,uVar4,0);
    }
  }
  sVar8 = local_88.content.size_;
  pcVar10 = local_88.content.ptr;
  if (local_88.content.ptr != (char *)0x0) {
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    (**(local_88.content.disposer)->_vptr_ArrayDisposer)
              (local_88.content.disposer,pcVar10,1,sVar8,sVar8,0);
  }
  return (int)pUVar9;
}

Assistant:

Url Url::clone() const {
  return {
    kj::str(scheme),
    userInfo.map([](const UserInfo& ui) -> UserInfo {
      return {
        kj::str(ui.username),
        ui.password.map([](const String& s) { return kj::str(s); })
      };
    }),
    kj::str(host),
    KJ_MAP(part, path) { return kj::str(part); },
    hasTrailingSlash,
    KJ_MAP(param, query) -> QueryParam {
      // Preserve the "allocated-ness" of `param.value` with this careful copy.
      return { kj::str(param.name), param.value.begin() == nullptr ? kj::String()
                                                                   : kj::str(param.value) };
    },
    fragment.map([](const String& s) { return kj::str(s); }),
    options
  };
}